

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_string.cpp
# Opt level: O2

void anon_unknown.dwarf_10a416::test_error(string *str)

{
  bool bVar1;
  Message *message;
  ScopedTrace gtest_trace_28;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  events_aggregator_t handler;
  string scope;
  istringstream input;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                 "test error when parse \'",str);
  std::operator+(&scope,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                 "\'");
  std::__cxx11::string::~string((string *)&input);
  testing::Message::Message((Message *)&input);
  message = testing::Message::operator<<((Message *)&input,&scope);
  testing::internal::ScopedTrace::ScopedTrace
            (&gtest_trace_28,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/literal_string.cpp"
             ,0x1c,message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&input);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handler,
                 "key = ",str);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&handler,_S_in);
  std::__cxx11::string::~string((string *)&handler);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  }
  testing::Message::Message((Message *)&local_1e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/literal_string.cpp"
             ,0x21,
             "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
  testing::internal::AssertHelper::~AssertHelper(&local_1e8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_1e0);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  testing::internal::ScopedTrace::~ScopedTrace(&gtest_trace_28);
  std::__cxx11::string::~string((string *)&scope);
  return;
}

Assistant:

void test_error(const std::string &str) {
        std::string scope = "test error when parse '" + str + "'";
        SCOPED_TRACE(scope);

        std::istringstream input("key = " + str);
        events_aggregator_t handler;

        EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
    }